

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpsreader_test.cc
# Opt level: O1

void __thiscall
fizplex::MPSReaderTest_BadRhsNumberFormatThrows_Test::TestBody
          (MPSReaderTest_BadRhsNumberFormatThrows_Test *this)

{
  bool bVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  AssertHelper local_c8;
  string local_c0;
  LP local_a0;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,"./test/bad_rhs_number_format.mps","");
    MPSReader::read_lp(&local_a0,&local_c0);
    if (local_a0.rows.super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.rows.
                      super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_a0.rows.
                            super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a0.rows.
                            super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_a0.cols.super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.cols.
                      super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_a0.cols.
                            super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a0.cols.
                            super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    operator_delete(local_a0.c.vals._M_data);
    operator_delete(local_a0.b.vals._M_data);
    std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector
              ((vector<fizplex::SVector,_std::allocator<fizplex::SVector>_> *)&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
  }
  testing::Message::Message((Message *)&local_d0);
  testing::internal::AssertHelper::AssertHelper
            (&local_c8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/mpsreader_test.cc"
             ,0x2c,
             "Expected: MPSReader::read_lp(\"./test/bad_rhs_number_format.mps\") throws an exception of type std::invalid_argument.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
  testing::internal::AssertHelper::~AssertHelper(&local_c8);
  if (((local_d0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
     (local_d0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(long *)local_d0.ptr_ + 8))();
  }
  return;
}

Assistant:

TEST(MPSReaderTest, BadRhsNumberFormatThrows) {
  EXPECT_THROW(MPSReader::read_lp("./test/bad_rhs_number_format.mps"),
               std::invalid_argument);
}